

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O2

void __thiscall Clasp::BasicSolve::reset(BasicSolve *this,bool reinit)

{
  State *this_00;
  
  this_00 = this->state_;
  if (this_00 == (State *)0x0 || reinit) {
    if (this_00 != (State *)0x0) {
      State::~State(this_00);
    }
    operator_delete(this_00);
    this->state_ = (State *)0x0;
    return;
  }
  State::~State(this_00);
  State::State(this->state_,this->solver_,this->params_);
  return;
}

Assistant:

void BasicSolve::reset(bool reinit) {
	if (!state_ || reinit) {
		delete state_;
		state_ = 0;
	}
	else {
		state_->~State();
		new (state_) State(*solver_, *params_);
	}
}